

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

bool am_remove_match_command(Am_Object *match_command)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  Am_Object installed_on_command;
  Am_Object_Method do_method;
  
  pAVar1 = Am_Object::Get(match_command,Am_INSTALLED_ON_COMMAND,0);
  Am_Object::Am_Object(&installed_on_command,pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"*Removing match_command ");
  poVar2 = operator<<(poVar2,match_command);
  poVar2 = std::operator<<(poVar2," for ");
  poVar2 = operator<<(poVar2,&installed_on_command);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  pAVar1 = Am_Object::Get(&installed_on_command,Am_REAL_DO_METHOD,3);
  Am_Object_Method::Am_Object_Method(&do_method,pAVar1);
  Am_Object::Set(&installed_on_command,0xca,do_method.from_wrapper,0);
  Am_Object::Set(&installed_on_command,Am_INVOKE_MATCH_COMMAND,0,0);
  Am_Object::~Am_Object(&installed_on_command);
  return true;
}

Assistant:

bool
am_remove_match_command(Am_Object &match_command)
{
  Am_Object installed_on_command = match_command.Get(Am_INSTALLED_ON_COMMAND);
  std::cout << "*Removing match_command " << match_command << " for "
            << installed_on_command << std::endl
            << std::flush;
  Am_Object_Method do_method =
      installed_on_command.Get(Am_REAL_DO_METHOD, Am_RETURN_ZERO_ON_ERROR);
  installed_on_command.Set(Am_DO_METHOD, do_method);
  installed_on_command.Set(Am_INVOKE_MATCH_COMMAND, (0L));
  return true;
}